

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixels.c
# Opt level: O3

ALLEGRO_COLOR al_map_rgba_f(float r,float g,float b,float a)

{
  ALLEGRO_COLOR AVar1;
  
  AVar1.g = g;
  AVar1.r = r;
  AVar1.a = a;
  AVar1.b = b;
  return AVar1;
}

Assistant:

ALLEGRO_COLOR al_map_rgba_f(float r, float g, float b, float a)
{
   ALLEGRO_COLOR color;
   color.r = r;
   color.g = g;
   color.b = b;
   color.a = a;
   return color;
}